

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testConsumeSubQuery(void)

{
  FILE *__stream;
  bool bVar1;
  string subQuery;
  string local_50;
  TokenQueue tokenQueue;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ol, ol > li + li",(allocator<char> *)&subQuery);
  crawler::TokenQueue::TokenQueue(&tokenQueue,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  crawler::TokenQueue::consumeSubQuery_abi_cxx11_(&subQuery,&tokenQueue);
  test_count = test_count + 1;
  bVar1 = std::operator==(&subQuery,"ol");
  __stream = _stderr;
  if (bVar1) {
    test_pass = test_pass + 1;
  }
  else {
    bVar1 = std::operator==(&subQuery,"ol");
    fprintf(__stream,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testConsumeSubQuery",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x101,"true == (subQuery == \"ol\")",1,(ulong)bVar1);
  }
  std::__cxx11::string::~string((string *)&subQuery);
  std::__cxx11::string::~string((string *)&tokenQueue);
  return;
}

Assistant:

void testConsumeSubQuery() {
  crawler::TokenQueue tokenQueue("ol, ol > li + li");
  const std::string subQuery = tokenQueue.consumeSubQuery();
  ASSERT_TRUE(subQuery == "ol");
}